

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O3

void COST_SENSITIVE::output_example(vw *all,example *ec)

{
  float fVar1;
  int iVar2;
  int *piVar3;
  namedlabels *pnVar4;
  pointer psVar5;
  _func_void_int_string_v_array<char> *p_Var6;
  v_array<char> vVar7;
  v_array<char> vVar8;
  wclass *pwVar9;
  ostream *poVar10;
  ulong uVar11;
  long lVar12;
  wclass *__end2;
  wclass *pwVar13;
  char *pcVar14;
  bool bVar15;
  uint uVar16;
  undefined8 uVar17;
  ulong uVar18;
  wclass *pwVar19;
  int *piVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  stringstream outputStringStream;
  undefined7 in_stack_fffffffffffffde8;
  char in_stack_fffffffffffffdef;
  undefined4 uVar24;
  float in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  v_array<char> *pvVar25;
  vw *pvVar26;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pwVar9 = (ec->l).cs.costs._begin;
  pwVar13 = (ec->l).cs.costs._end;
  uVar11 = (long)pwVar13 - (long)pwVar9 >> 4;
  fVar21 = 0.0;
  pvVar26 = all;
  if (pwVar13 != pwVar9) {
    uVar16 = 1;
    uVar18 = 0;
LAB_00240a13:
    if ((pwVar9[uVar18].x == 3.4028235e+38) && (!NAN(pwVar9[uVar18].x))) goto code_r0x00240a23;
    fVar22 = 3.4028235e+38;
    pwVar19 = pwVar9;
    fVar23 = 3.4028235e+38;
    do {
      fVar1 = pwVar19->x;
      fVar21 = fVar1;
      if (pwVar19->class_index != (ec->pred).multiclass) {
        fVar21 = fVar23;
      }
      if (fVar22 <= fVar1) {
        fVar1 = fVar22;
      }
      fVar22 = fVar1;
      pwVar19 = pwVar19 + 1;
      fVar23 = fVar21;
    } while (pwVar19 != pwVar13);
    if ((fVar21 == 3.4028235e+38) && (!NAN(fVar21))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "warning: csoaa predicted an invalid class. Are all multi-class labels in the {1..k} range?"
                 ,0x5a);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      pvVar26 = all;
      std::ostream::put('\x10');
      std::ostream::flush();
      pwVar9 = (ec->l).cs.costs._begin;
      pwVar13 = (ec->l).cs.costs._end;
      uVar11 = (long)pwVar13 - (long)pwVar9 >> 4;
      in_stack_fffffffffffffdf8 = fVar22;
    }
    fVar21 = fVar21 - fVar22;
  }
LAB_00240ae5:
  if (pwVar13 == pwVar9) {
    bVar15 = false;
  }
  else {
    uVar16 = 1;
    uVar18 = 0;
    do {
      fVar23 = pwVar9[uVar18].x;
      bVar15 = (bool)(-(fVar23 != 3.4028235e+38) & 1);
      if ((fVar23 != 3.4028235e+38) || (NAN(fVar23))) break;
      uVar18 = (ulong)uVar16;
      uVar16 = uVar16 + 1;
    } while (uVar18 < uVar11);
  }
  shared_data::update(all->sd,ec->test_only,bVar15,fVar21,1.0,ec->num_features);
  pvVar25 = (v_array<char> *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8);
  piVar20 = (all->final_prediction_sink)._begin;
  piVar3 = (all->final_prediction_sink)._end;
  fVar21 = SUB84(piVar3,0);
  uVar24 = (undefined4)((ulong)piVar3 >> 0x20);
  if (piVar20 != piVar3) {
    pvVar25 = &ec->tag;
    do {
      iVar2 = *piVar20;
      pnVar4 = all->sd->ldict;
      if (pnVar4 == (namedlabels *)0x0) {
        (*all->print)(iVar2,(float)(ec->pred).multiclass,0.0,*pvVar25);
      }
      else {
        uVar16 = (ec->pred).multiclass - 1;
        pcVar14 = (char *)0x0;
        uVar17 = 0;
        if (uVar16 < pnVar4->K) {
          psVar5 = (pnVar4->id2name).super__Vector_base<substring,_std::allocator<substring>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar17 = psVar5[uVar16].begin;
          pcVar14 = psVar5[uVar16].end;
        }
        p_Var6 = pvVar26->print_text;
        local_1f8[0] = local_1e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,uVar17,pcVar14);
        vVar7._begin._7_1_ = in_stack_fffffffffffffdef;
        vVar7._begin._0_7_ = in_stack_fffffffffffffde8;
        vVar7._end._0_4_ = fVar21;
        vVar7._end._4_4_ = uVar24;
        vVar7.end_array._0_4_ = (int)pvVar25;
        vVar7.end_array._4_4_ = (int)((ulong)pvVar25 >> 0x20);
        vVar7.erase_count = (size_t)pvVar26;
        all = pvVar26;
        (*p_Var6)(iVar2,(string)*pvVar25,vVar7);
        pvVar26 = all;
        if (local_1f8[0] != local_1e8) {
          operator_delete(local_1f8[0]);
        }
      }
      piVar20 = piVar20 + 1;
    } while (piVar20 != (int *)CONCAT44(uVar24,fVar21));
  }
  if (0 < all->raw_prediction) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    pwVar9 = (ec->l).cs.costs._begin;
    all = pvVar26;
    if ((ec->l).cs.costs._end != pwVar9) {
      uVar16 = 1;
      uVar11 = 0;
      do {
        fVar21 = pwVar9[uVar11].partial_prediction;
        if (uVar16 != 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,&stack0xfffffffffffffdef,1);
        }
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        in_stack_fffffffffffffdef = ':';
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,&stack0xfffffffffffffdef,1);
        std::ostream::_M_insert<double>((double)fVar21);
        uVar11 = (ulong)uVar16;
        pwVar9 = (ec->l).cs.costs._begin;
        uVar16 = uVar16 + 1;
      } while (uVar11 < (ulong)((long)(ec->l).cs.costs._end - (long)pwVar9 >> 4));
    }
    p_Var6 = all->print_text;
    iVar2 = all->raw_prediction;
    pvVar26 = all;
    std::__cxx11::stringbuf::str();
    vVar8._begin._7_1_ = in_stack_fffffffffffffdef;
    vVar8._begin._0_7_ = in_stack_fffffffffffffde8;
    vVar8._end._0_4_ = fVar21;
    vVar8._end._4_4_ = uVar24;
    vVar8.end_array._0_4_ = (int)pvVar25;
    vVar8.end_array._4_4_ = (int)((ulong)pvVar25 >> 0x20);
    vVar8.erase_count = (size_t)pvVar26;
    (*p_Var6)(iVar2,(string)ec->tag,vVar8);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  pwVar9 = (ec->l).cs.costs._begin;
  lVar12 = (long)(ec->l).cs.costs._end - (long)pwVar9;
  if (lVar12 == 0) {
    bVar15 = true;
  }
  else {
    uVar16 = 1;
    uVar11 = 0;
    do {
      fVar21 = pwVar9[uVar11].x;
      bVar15 = (bool)(-(fVar21 == 3.4028235e+38) & 1);
      if ((fVar21 != 3.4028235e+38) || (NAN(fVar21))) break;
      uVar11 = (ulong)uVar16;
      uVar16 = uVar16 + 1;
    } while (uVar11 < (ulong)(lVar12 >> 4));
  }
  print_update(all,bVar15,ec,(multi_ex *)0x0,false,(ec->pred).multiclass);
  return;
code_r0x00240a23:
  uVar18 = (ulong)uVar16;
  uVar16 = uVar16 + 1;
  if (uVar11 <= uVar18) goto LAB_00240ae5;
  goto LAB_00240a13;
}

Assistant:

void output_example(vw& all, example& ec)
{
  label& ld = ec.l.cs;

  float loss = 0.;
  if (!test_label(&ld))
  {
    // need to compute exact loss
    size_t pred = (size_t)ec.pred.multiclass;

    float chosen_loss = FLT_MAX;
    float min = FLT_MAX;
    for (auto& cl : ld.costs)
    {
      if (cl.class_index == pred)
        chosen_loss = cl.x;
      if (cl.x < min)
        min = cl.x;
    }
    if (chosen_loss == FLT_MAX)
      cerr << "warning: csoaa predicted an invalid class. Are all multi-class labels in the {1..k} range?" << endl;

    loss = chosen_loss - min;
    // TODO(alberto): add option somewhere to allow using absolute loss instead?
    // loss = chosen_loss;
  }

  all.sd->update(ec.test_only, !test_label(&ld), loss, 1.f, ec.num_features);

  for (int sink : all.final_prediction_sink)
    if (!all.sd->ldict)
      all.print(sink, (float)ec.pred.multiclass, 0, ec.tag);
    else
    {
      substring ss_pred = all.sd->ldict->get(ec.pred.multiclass);
      all.print_text(sink, string(ss_pred.begin, ss_pred.end - ss_pred.begin), ec.tag);
    }

  if (all.raw_prediction > 0)
  {
    stringstream outputStringStream;
    for (unsigned int i = 0; i < ld.costs.size(); i++)
    {
      wclass cl = ld.costs[i];
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << cl.class_index << ':' << cl.partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  print_update(all, test_label(&ec.l.cs), ec, nullptr, false, ec.pred.multiclass);
}